

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

Matcher<const_std::pair<int,_phmap::priv::NonStandardLayout>_&> *
testing::internal::
MatcherCastImpl<const_std::pair<int,_phmap::priv::NonStandardLayout>_&,_std::pair<const_int,_phmap::priv::NonStandardLayout>_>
::CastImpl(Matcher<const_std::pair<int,_phmap::priv::NonStandardLayout>_&> *__return_storage_ptr__,
          pair<const_int,_phmap::priv::NonStandardLayout> *value)

{
  pair<int,_phmap::priv::NonStandardLayout> *value_00;
  pair<int,_phmap::priv::NonStandardLayout> local_50;
  pair<const_int,_phmap::priv::NonStandardLayout> *local_20;
  pair<const_int,_phmap::priv::NonStandardLayout> *value_local;
  Matcher<const_std::pair<int,_phmap::priv::NonStandardLayout>_&> *local_10;
  
  local_20 = value;
  local_10 = __return_storage_ptr__;
  std::pair<int,_phmap::priv::NonStandardLayout>::
  pair<const_int,_phmap::priv::NonStandardLayout,_true>(&local_50,value);
  value_00 = ImplicitCast_<std::pair<int,phmap::priv::NonStandardLayout>const&>(&local_50);
  Matcher<const_std::pair<int,_phmap::priv::NonStandardLayout>_&>::Matcher
            (__return_storage_ptr__,value_00);
  std::pair<int,_phmap::priv::NonStandardLayout>::~pair(&local_50);
  return __return_storage_ptr__;
}

Assistant:

static Matcher<T> CastImpl(const M& value,
                             std::false_type /* convertible_to_matcher */,
                             std::true_type /* convertible_to_T */) {
    return Matcher<T>(ImplicitCast_<T>(value));
  }